

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgStack.h
# Opt level: O2

dgBigVector * __thiscall dgStack<dgBigVector>::operator[](dgStack<dgBigVector> *this,HaI32 entry)

{
  uint __line;
  char *__assertion;
  
  if (entry < 0) {
    __assertion = "entry >= 0";
    __line = 0x5f;
  }
  else {
    if (this->m_size == 0 && entry == 0 || entry < this->m_size) {
      return (dgBigVector *)((ulong)(uint)entry * 0x20 + (long)(this->super_dgStackBase).m_ptr);
    }
    __assertion = "(entry < m_size) || ((m_size == 0) && (entry == 0))";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,__line,"T &dgStack<dgBigVector>::operator[](hacd::HaI32) [T = dgBigVector]");
}

Assistant:

T& dgStack<T>::operator[] (hacd::HaI32 entry) 
{
	T *mem;

	HACD_ASSERT (entry >= 0);
	HACD_ASSERT ((entry < m_size) || ((m_size == 0) && (entry == 0)));

	mem = (T*) m_ptr;
	return mem[entry];
}